

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void __thiscall UtilTest_byteswap_Test::TestBody(UtilTest_byteswap_Test *this)

{
  bool bVar1;
  Message *pMVar2;
  char *pcVar3;
  AssertHelper local_b8 [8];
  unsigned_long local_b0;
  Message local_a8 [8];
  unsigned_long local_a0;
  unsigned_long local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  uint local_74;
  Message local_70 [8];
  uint local_68;
  uint local_64;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  unsigned_short local_42;
  Message local_40 [28];
  unsigned_short local_24;
  unsigned_short local_22;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  UtilTest_byteswap_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_22 = jessilib::byteswap<unsigned_short>(0x1234);
  local_24 = 0x3412;
  testing::internal::EqHelper::Compare<unsigned_short,_unsigned_short,_nullptr>
            ((EqHelper *)local_20,"byteswap(uint16_t{0x1234})","uint16_t{0x3412}",&local_22,
             &local_24);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pMVar2 = testing::Message::operator<<(local_40,(char (*) [6])"hex: ");
    pMVar2 = testing::Message::operator<<(pMVar2,std::hex);
    local_42 = jessilib::byteswap<unsigned_short>(0x1234);
    pMVar2 = testing::Message::operator<<(pMVar2,&local_42);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x23,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_64 = jessilib::byteswap<unsigned_int>(0x12345678);
  local_68 = 0x78563412;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_60,"byteswap(uint32_t{0x12345678UL})","uint32_t{0x78563412UL}",
             &local_64,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pMVar2 = testing::Message::operator<<(local_70,(char (*) [6])"hex: ");
    pMVar2 = testing::Message::operator<<(pMVar2,std::hex);
    local_74 = jessilib::byteswap<unsigned_int>(0x12345678);
    pMVar2 = testing::Message::operator<<(pMVar2,&local_74);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x25,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,pMVar2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_98 = jessilib::byteswap<unsigned_long>(0x123456789abcdef0);
  local_a0 = 0xf0debc9a78563412;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_90,"byteswap(uint64_t{0x123456789ABCDEF0ULL})",
             "uint64_t{0xF0DEBC9A78563412ULL}",&local_98,&local_a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(local_a8);
    pMVar2 = testing::Message::operator<<(local_a8,(char (*) [6])"hex: ");
    pMVar2 = testing::Message::operator<<(pMVar2,std::hex);
    local_b0 = jessilib::byteswap<unsigned_long>(0x123456789abcdef0);
    pMVar2 = testing::Message::operator<<(pMVar2,&local_b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              (local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/util.cpp"
               ,0x27,pcVar3);
    testing::internal::AssertHelper::operator=(local_b8,pMVar2);
    testing::internal::AssertHelper::~AssertHelper(local_b8);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  return;
}

Assistant:

TEST(UtilTest, byteswap) {
	EXPECT_EQ(byteswap(uint16_t{0x1234}), uint16_t{0x3412})
		<< "hex: " << std::hex << byteswap(uint16_t{0x1234});
	EXPECT_EQ(byteswap(uint32_t{0x12345678UL}), uint32_t{0x78563412UL})
		<< "hex: " << std::hex << byteswap(uint32_t{0x12345678UL});
	EXPECT_EQ(byteswap(uint64_t{0x123456789ABCDEF0ULL}), uint64_t{0xF0DEBC9A78563412ULL})
		<< "hex: " << std::hex << byteswap(uint64_t{0x123456789ABCDEF0ULL});
}